

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# util.c
# Opt level: O0

uint int_pow(uint base,uint n)

{
  undefined4 local_18;
  undefined4 local_14;
  uint power;
  uint result;
  uint n_local;
  uint base_local;
  
  local_14 = 1;
  local_18 = base;
  for (power = n; power != 0; power = power >> 1) {
    if ((power & 1) != 0) {
      local_14 = local_18 * local_14;
    }
    local_18 = local_18 * local_18;
  }
  return local_14;
}

Assistant:

unsigned int_pow( unsigned base, unsigned n )
{
    unsigned result = 1;
    unsigned power = base;
    while (n > 0) {
        if ( n & 0x1 )
            result *= power;
            
        n >>= 1;
        power = power * power;
    }
        
    return result; 
}